

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# armci.c
# Opt level: O0

void PARMCI_Memctl(armci_meminfo_t *meminfo)

{
  int *in_RDI;
  void *ptr;
  int rank;
  undefined8 in_stack_ffffffffffffffe8;
  int code;
  undefined4 in_stack_fffffffffffffff0;
  int in_stack_fffffffffffffff4;
  
  code = (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20);
  comex_group_rank(ptr._4_4_,in_RDI);
  if (in_RDI == (int *)0x0) {
    comex_error((char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),code);
  }
  if (in_RDI[6] == in_stack_fffffffffffffff4) {
    comex_free_local((void *)0x1c263f);
  }
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  in_RDI[0] = 0;
  in_RDI[1] = 0;
  return;
}

Assistant:

void PARMCI_Memctl(armci_meminfo_t *meminfo)
{
    int rank;

    comex_group_rank(COMEX_GROUP_WORLD, &rank);

    if(meminfo==NULL) comex_error("PARMCI_Memget: Invalid arg #2 (NULL ptr)",0);

    /* only the creator can delete the segment */
    if(meminfo->cpid == rank)
    {
        void *ptr = meminfo->addr;
        comex_free_local(ptr);
    }

    meminfo->addr       = NULL;
    meminfo->armci_addr = NULL;
    /* if(meminfo->attr!=NULL) free(meminfo->attr); */
}